

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

bool __thiscall uttt::IBoard::operator==(IBoard *this,IBoard *other)

{
  bool bVar1;
  IBoard vertical;
  IBoard rotated;
  IBoard local_58;
  IBoard local_38;
  
  if (((this->macro == other->macro) && (bVar1 = std::operator==(&this->micro,&other->micro), bVar1)
      ) && (this->next == other->next)) {
    return true;
  }
  local_38._16_8_ = *(undefined8 *)((this->micro)._M_elems + 6);
  local_38.macro = this->macro;
  local_38.micro._M_elems[0] = (this->micro)._M_elems[0];
  local_38.micro._M_elems[1] = (this->micro)._M_elems[1];
  local_38.micro._M_elems._4_8_ = *(undefined8 *)((this->micro)._M_elems + 2);
  RotateClockWise90(&local_38);
  if (((local_38.macro == other->macro) &&
      (bVar1 = std::operator==(&local_38.micro,&other->micro), bVar1)) &&
     (local_38.next == other->next)) {
    return true;
  }
  RotateClockWise90(&local_38);
  if (((local_38.macro == other->macro) &&
      (bVar1 = std::operator==(&local_38.micro,&other->micro), bVar1)) &&
     (local_38.next == other->next)) {
    return true;
  }
  RotateClockWise90(&local_38);
  if (((local_38.macro == other->macro) &&
      (bVar1 = std::operator==(&local_38.micro,&other->micro), bVar1)) &&
     (local_38.next == other->next)) {
    return true;
  }
  local_58._16_8_ = *(undefined8 *)((this->micro)._M_elems + 6);
  local_58.macro = this->macro;
  local_58.micro._M_elems[0] = (this->micro)._M_elems[0];
  local_58.micro._M_elems[1] = (this->micro)._M_elems[1];
  local_58.micro._M_elems._4_8_ = *(undefined8 *)((this->micro)._M_elems + 2);
  MirrorVertical(&local_58);
  if (((local_58.macro == other->macro) &&
      (bVar1 = std::operator==(&local_58.micro,&other->micro), bVar1)) &&
     (local_58.next == other->next)) {
    return true;
  }
  RotateClockWise90(&local_58);
  if (((local_58.macro == other->macro) &&
      (bVar1 = std::operator==(&local_58.micro,&other->micro), bVar1)) &&
     (local_58.next == other->next)) {
    return true;
  }
  RotateClockWise90(&local_58);
  if (((local_58.macro == other->macro) &&
      (bVar1 = std::operator==(&local_58.micro,&other->micro), bVar1)) &&
     (local_58.next == other->next)) {
    return true;
  }
  RotateClockWise90(&local_58);
  if (((local_58.macro == other->macro) &&
      (bVar1 = std::operator==(&local_58.micro,&other->micro), bVar1)) &&
     (local_58.next == other->next)) {
    return true;
  }
  return false;
}

Assistant:

bool
IBoard::operator==(const IBoard &other) const
{
    if (macro == other.macro && micro == other.micro && next == other.next)
        return true;
    IBoard rotated(*this);
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;

    IBoard vertical(*this);
    vertical.MirrorVertical();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    return false;
}